

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Service_Request_PDU::operator==(Service_Request_PDU *this,Service_Request_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Logistics_Header::operator!=((Logistics_Header *)this,(Logistics_Header *)Value);
  if (((KVar1) || (this->m_ui8ServiceTypeRequested != Value->m_ui8ServiceTypeRequested)) ||
     ((this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes !=
      (Value->super_Resupply_Received_PDU).m_ui8NumSupplyTypes)) {
    bVar2 = false;
  }
  else {
    bVar2 = std::operator!=(&(this->super_Resupply_Received_PDU).m_vSupplies,
                            &(Value->super_Resupply_Received_PDU).m_vSupplies);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

KBOOL Service_Request_PDU::operator == ( const Service_Request_PDU & Value ) const
{
    if( Logistics_Header::operator  !=( Value ) )                        return false;
    if( m_ui8ServiceTypeRequested   != Value.m_ui8ServiceTypeRequested ) return false;
    if( m_ui8NumSupplyTypes         != Value.m_ui8NumSupplyTypes )       return false;
    if( m_vSupplies                 != Value.m_vSupplies )               return false;
    return true;
}